

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O2

void __thiscall Lib::Deque<Kernel::TermList>::expand(Deque<Kernel::TermList> *this)

{
  long lVar1;
  undefined8 *__ptr;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 *puVar4;
  size_t i;
  long lVar5;
  long lVar6;
  
  lVar1 = *(long *)this;
  lVar5 = 0;
  lVar6 = 0;
  if (*(ulong *)(this + 0x18) < *(ulong *)(this + 0x10)) {
    lVar6 = lVar1;
  }
  lVar6 = (*(ulong *)(this + 0x18) + lVar6 * 8) - *(ulong *)(this + 0x10);
  pvVar3 = Lib::alloc(lVar1 * 0x10);
  __ptr = *(undefined8 **)(this + 8);
  puVar4 = *(undefined8 **)(this + 0x10);
  puVar2 = *(undefined8 **)(this + 0x20);
  for (; lVar6 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    *(undefined8 *)((long)pvVar3 + lVar5 * 8) = *puVar4;
    puVar4 = puVar4 + 1;
    if (puVar4 == puVar2) {
      puVar4 = __ptr;
    }
  }
  Lib::free(__ptr);
  *(void **)(this + 8) = pvVar3;
  *(void **)(this + 0x10) = pvVar3;
  *(long *)(this + 0x18) = lVar6 + (long)pvVar3;
  *(void **)(this + 0x20) = (void *)(lVar1 * 0x10 + (long)pvVar3);
  *(long *)this = lVar1 * 2;
  return;
}

Assistant:

void expand ()
  {
    ASS(shouldExpand());

    size_t curSize=size();
    size_t newCapacity = 2 * _capacity;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),"Deque<>");

    C* newData = static_cast<C*>(mem);
    C* oldPtr=_front;
    for(size_t i = 0; i<curSize; i++) {
      ::new (newData+i) C(*oldPtr);
      oldPtr->~C();

      oldPtr++;
      if(oldPtr==_end) {
	oldPtr=_data;
      }
    }
    ASS_EQ(oldPtr, _back);
    // deallocate the old stack
    DEALLOC_KNOWN(_data,_capacity*sizeof(C),"Deque<>");

    _data = newData;
    _front = _data;
    _back = _data + curSize;
    _end = _data + newCapacity;
    _capacity = newCapacity;
  }